

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

obj * save_mtraits(obj *obj,monst *mtmp)

{
  byte bVar1;
  short sVar2;
  int iVar3;
  size_t sVar4;
  obj *poVar5;
  int local_38;
  monst *mtmp2;
  int namelth;
  int lth;
  obj *otmp;
  monst *mtmp_local;
  obj *obj_local;
  
  sVar2 = mtmp->mxlth;
  bVar1 = mtmp->mnamelth;
  if (obj->onamelth == '\0') {
    local_38 = 0;
  }
  else {
    sVar4 = strlen((char *)((long)obj->oextra + (long)(int)obj->oxlth));
    local_38 = (int)sVar4 + 1;
  }
  poVar5 = realloc_obj(obj,sVar2 + 0x78 + (uint)bVar1,mtmp,local_38,
                       (char *)((long)obj->oextra + (long)(int)obj->oxlth));
  if ((poVar5 != (obj *)0x0) && (poVar5->oxlth != 0)) {
    if (mtmp->data != (permonst *)0x0) {
      iVar3 = monsndx(mtmp->data);
      poVar5[1].where = (char)(short)iVar3;
      poVar5[1].timed = (char)((ushort)(short)iVar3 >> 8);
    }
    *(undefined8 *)poVar5->oextra = 0;
    *(undefined8 *)((long)&poVar5[1].nobj + 4) = 0;
    *(undefined8 *)((long)&poVar5[1].cobj + 4) = 0;
    *(uint *)&poVar5->field_0x4a = *(uint *)&poVar5->field_0x4a & 0xff9fffff | 0x200000;
  }
  return poVar5;
}

Assistant:

static struct obj *save_mtraits(struct obj *obj, struct monst *mtmp)
{
	struct obj *otmp;
	int lth, namelth;

	lth = sizeof(struct monst) + mtmp->mxlth + mtmp->mnamelth;
	namelth = obj->onamelth ? strlen(ONAME(obj)) + 1 : 0;
	otmp = realloc_obj(obj, lth, mtmp, namelth, ONAME(obj));
	if (otmp && otmp->oxlth) {
		struct monst *mtmp2 = (struct monst *)otmp->oextra;
		if (mtmp->data) mtmp2->mnum = monsndx(mtmp->data);
		/* invalidate pointers */
		/* m_id is needed to know if this is a revived quest leader */
		/* but m_id must be cleared when loading bones */
		mtmp2->nmon     = NULL;
		mtmp2->data     = NULL;
		mtmp2->minvent  = NULL;
		otmp->oattached = OATTACHED_MONST;	/* mark it */
	}
	return otmp;
}